

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::runProcess(QMakeEvaluator *this,QProcess *proc,QString *command)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QList<QString> *pQVar1;
  qsizetype in_RDX;
  rvalue_ref in_RSI;
  long in_FS_OFFSET;
  QList<QString> *this_00;
  QMakeEvaluator *in_stack_ffffffffffffff28;
  rvalue_ref s;
  QLatin1String *in_stack_ffffffffffffff30;
  int iVar2;
  rvalue_ref pQVar3;
  undefined1 local_38 [24];
  QList<QString> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  s = in_RSI;
  currentDirectory(in_stack_ffffffffffffff28);
  QProcess::setWorkingDirectory((QString *)in_RSI);
  QString::~QString((QString *)0x2c77a3);
  pQVar3 = s;
  QLatin1String::QLatin1String(in_stack_ffffffffffffff30,(char *)s);
  latin1.m_data = (char *)pQVar3;
  latin1.m_size = in_RDX;
  QString::QString((QString *)in_stack_ffffffffffffff30,latin1);
  QList<QString>::QList((QList<QString> *)0x2c780c);
  QLatin1String::QLatin1String(in_stack_ffffffffffffff30,(char *)s);
  latin1_00.m_data = (char *)pQVar3;
  latin1_00.m_size = in_RDX;
  QString::QString((QString *)in_stack_ffffffffffffff30,latin1_00);
  iVar2 = (int)pQVar3;
  QList<QString>::operator<<(this_00,in_RSI);
  pQVar1 = QList<QString>::operator<<(this_00,in_RSI);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,(OpenModeFlag)((ulong)in_RSI >> 0x20));
  QProcess::start((QString *)s,(QList_conflict2 *)local_38,(QFlags_conflict *)pQVar1);
  QString::~QString((QString *)0x2c7888);
  QList<QString>::~QList((QList<QString> *)0x2c7892);
  QString::~QString((QString *)0x2c789c);
  QProcess::waitForFinished(iVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::runProcess(QProcess *proc, const QString &command) const
{
    proc->setWorkingDirectory(currentDirectory());
# ifdef PROEVALUATOR_SETENV
    if (!m_option->environment.isEmpty())
        proc->setProcessEnvironment(m_option->environment);
# endif
# ifdef Q_OS_WIN
    proc->setNativeArguments(QLatin1String("/v:off /s /c \"") + command + QLatin1Char('"'));
    proc->start(m_option->getEnv(QLatin1String("COMSPEC")), QStringList());
# else
    proc->start(QLatin1String("/bin/sh"), QStringList() << QLatin1String("-c") << command);
# endif
    proc->waitForFinished(-1);
}